

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.h
# Opt level: O3

void __thiscall slang::parsing::PreprocessorOptions::~PreprocessorOptions(PreprocessorOptions *this)

{
  value_type_pointer p;
  pointer p_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  
  p = (this->ignoreDirectives).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
      .arrays.elements_;
  if (p != (value_type_pointer)0x0) {
    operator_delete(p,(this->ignoreDirectives).table_.
                      super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                      .arrays.groups_size_mask * 0x100 + 0x100);
  }
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector(&this->additionalIncludePaths);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->undefines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->predefines);
  p_00 = (this->predefineSource)._M_dataplus._M_p;
  paVar1 = &(this->predefineSource).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p_00 != paVar1) {
    operator_delete(p_00,paVar1->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

struct SLANG_EXPORT PreprocessorOptions {
    /// The maximum depth of the include stack; further attempts to include
    /// a file will result in an error.
    uint32_t maxIncludeDepth = 1024;

    /// The version of the SystemVerilog language to use.
    LanguageVersion languageVersion = LanguageVersion::Default;

    /// The name to associate with errors produced by macros specified
    /// via the @a predefines option.
    std::string predefineSource = "<api>";

    /// A set of macros to predefine, of the form &lt;macro>=&lt;value> or
    /// just &lt;macro> to predefine to a value of 1.
    std::vector<std::string> predefines;

    /// A set of macro names to undefine at the start of file preprocessing.
    std::vector<std::string> undefines;

    /// Additional include paths to use when preprocessing.
    std::vector<std::filesystem::path> additionalIncludePaths;

    /// A set of preprocessor directives to be ignored.
    flat_hash_set<std::string_view> ignoreDirectives;
}